

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
::infoz(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
        *this)

{
  bool bVar1;
  CommonFields *this_00;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  *this_local;
  
  bVar1 = is_soo(this);
  if (bVar1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x102c,
                  "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::infoz() [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  this_00 = common(this);
  CommonFields::infoz(this_00);
  return;
}

Assistant:

HashtablezInfoHandle infoz() {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    return common().infoz();
  }